

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools.cpp
# Opt level: O1

int Version(void)

{
  ostream *poVar1;
  stringstream versionStream;
  char local_1b0;
  undefined7 uStack_1af;
  long local_1a8;
  undefined1 local_1a0 [16];
  stringstream local_190 [16];
  undefined1 local_180 [112];
  ios_base local_110 [264];
  
  std::__cxx11::stringstream::stringstream(local_190);
  poVar1 = (ostream *)std::ostream::operator<<(local_180,2);
  local_1b0 = '.';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1b0,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,5);
  local_1b0 = '.';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1b0,1);
  std::ostream::operator<<(poVar1,2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bamtools ",9);
  std::__cxx11::stringbuf::str();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)CONCAT71(uStack_1af,local_1b0),local_1a8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((undefined1 *)CONCAT71(uStack_1af,local_1b0) != local_1a0) {
    operator_delete((undefined1 *)CONCAT71(uStack_1af,local_1b0));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Part of BamTools API and toolkit",0x20);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Primary authors: Derek Barnett, Erik Garrison, Michael Stromberg",0x40);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"(c) 2009-2012 Marth Lab, Biology Dept., Boston College",0x36);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__cxx11::stringstream::~stringstream(local_190);
  std::ios_base::~ios_base(local_110);
  return 0;
}

Assistant:

int Version()
{

    std::stringstream versionStream;
    versionStream << BAMTOOLS_VERSION_MAJOR << '.' << BAMTOOLS_VERSION_MINOR << '.'
                  << BAMTOOLS_VERSION_PATCH;

    std::cout << std::endl;
    std::cout << "bamtools " << versionStream.str() << std::endl;
    std::cout << "Part of BamTools API and toolkit" << std::endl;
    std::cout << "Primary authors: Derek Barnett, Erik Garrison, Michael Stromberg" << std::endl;
    std::cout << "(c) 2009-2012 Marth Lab, Biology Dept., Boston College" << std::endl;
    std::cout << std::endl;
    return EXIT_SUCCESS;
}